

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u16 selFlags,
                         Expr *pLimit,Expr *pOffset)

{
  sqlite3 *db;
  Select *p;
  Expr *pExpr;
  Select standin;
  
  db = pParse->db;
  p = (Select *)sqlite3DbMallocZero(db,0x78);
  if (p == (Select *)0x0) {
    p = &standin;
    standin.pRightmost = (Select *)0x0;
    standin.pLimit = (Expr *)0x0;
    standin.pPrior = (Select *)0x0;
    standin.pNext = (Select *)0x0;
    standin.pHaving = (Expr *)0x0;
    standin.pOrderBy = (ExprList *)0x0;
    standin.pWhere = (Expr *)0x0;
    standin.pGroupBy = (ExprList *)0x0;
    standin.nSelectRow = 0.0;
    standin.pSrc = (SrcList *)0x0;
    standin.iOffset = 0;
    standin.addrOpenEphm[0] = 0;
    standin.addrOpenEphm[1] = 0;
    standin.addrOpenEphm[2] = 0;
    standin.pEList = (ExprList *)0x0;
    standin.op = '\0';
    standin._9_1_ = 0;
    standin.selFlags = 0;
    standin.iLimit = 0;
    standin.pOffset = (Expr *)0x0;
  }
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(db,0x71,(char *)0x0);
    pEList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
  }
  p->pEList = pEList;
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)sqlite3DbMallocZero(db,0x70);
  }
  p->pSrc = pSrc;
  p->pWhere = pWhere;
  p->pGroupBy = pGroupBy;
  p->pHaving = pHaving;
  p->pOrderBy = pOrderBy;
  p->selFlags = selFlags;
  p->op = 't';
  p->pLimit = pLimit;
  p->pOffset = pOffset;
  p->addrOpenEphm[0] = -1;
  p->addrOpenEphm[1] = -1;
  p->addrOpenEphm[2] = -1;
  if (db->mallocFailed != '\0') {
    clearSelect(db,p);
    if (p != &standin) {
      sqlite3DbFree(db,p);
    }
    p = (Select *)0x0;
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u16 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit,         /* LIMIT value.  NULL means not used */
  Expr *pOffset         /* OFFSET value.  NULL means no offset */
){
  Select *pNew;
  Select standin;
  sqlite3 *db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  assert( db->mallocFailed || !pOffset || pLimit ); /* OFFSET implies LIMIT */
  if( pNew==0 ){
    assert( db->mallocFailed );
    pNew = &standin;
    memset(pNew, 0, sizeof(*pNew));
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db,TK_ALL,0));
  }
  pNew->pEList = pEList;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->selFlags = selFlags;
  pNew->op = TK_SELECT;
  pNew->pLimit = pLimit;
  pNew->pOffset = pOffset;
  assert( pOffset==0 || pLimit!=0 );
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->addrOpenEphm[2] = -1;
  if( db->mallocFailed ) {
    clearSelect(db, pNew);
    if( pNew!=&standin ) sqlite3DbFree(db, pNew);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}